

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O3

void leopard::ff16::FFT_DIT2(void *x,void *y,ffe_t log_m,uint64_t bytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint64_t uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  
  if (CpuHasAVX2 == '\x01') {
    auVar47[8] = 0xf;
    auVar47._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar47[9] = 0xf;
    auVar47[10] = 0xf;
    auVar47[0xb] = 0xf;
    auVar47[0xc] = 0xf;
    auVar47[0xd] = 0xf;
    auVar47[0xe] = 0xf;
    auVar47[0xf] = 0xf;
    auVar47[0x10] = 0xf;
    auVar47[0x11] = 0xf;
    auVar47[0x12] = 0xf;
    auVar47[0x13] = 0xf;
    auVar47[0x14] = 0xf;
    auVar47[0x15] = 0xf;
    auVar47[0x16] = 0xf;
    auVar47[0x17] = 0xf;
    auVar47[0x18] = 0xf;
    auVar47[0x19] = 0xf;
    auVar47[0x1a] = 0xf;
    auVar47[0x1b] = 0xf;
    auVar47[0x1c] = 0xf;
    auVar47[0x1d] = 0xf;
    auVar47[0x1e] = 0xf;
    auVar47[0x1f] = 0xf;
    lVar13 = (ulong)log_m * 0x100;
    auVar29 = *(undefined1 (*) [32])(Multiply256LUT + lVar13);
    auVar30 = *(undefined1 (*) [32])(Multiply256LUT + 0x20 + lVar13);
    auVar44 = *(undefined1 (*) [32])(Multiply256LUT + 0x40 + lVar13);
    auVar45 = *(undefined1 (*) [32])(Multiply256LUT + 0x60 + lVar13);
    auVar6 = *(undefined1 (*) [32])(Multiply256LUT + 0x80 + lVar13);
    auVar7 = *(undefined1 (*) [32])(Multiply256LUT + 0xa0 + lVar13);
    auVar8 = *(undefined1 (*) [32])(Multiply256LUT + 0xc0 + lVar13);
    auVar9 = *(undefined1 (*) [32])(Multiply256LUT + 0xe0 + lVar13);
    uVar12 = 0;
    do {
      auVar10 = *(undefined1 (*) [32])((long)y + uVar12);
      auVar11 = *(undefined1 (*) [32])((long)y + uVar12 + 0x20);
      auVar49 = vpsrlq_avx2(auVar10,4);
      auVar28 = vpand_avx2(auVar10,auVar47);
      auVar24 = vpandq_avx512vl(auVar11,auVar47);
      auVar51 = vpsrlq_avx2(auVar11,4);
      auVar49 = vpand_avx2(auVar49,auVar47);
      auVar26 = vpshufb_avx2(auVar29,auVar28);
      auVar25 = vpshufb_avx512vl(auVar44,auVar24);
      auVar28 = vpshufb_avx2(auVar6,auVar28);
      auVar27 = vpshufb_avx2(auVar30,auVar49);
      auVar49 = vpshufb_avx2(auVar7,auVar49);
      auVar26 = vpternlogq_avx512vl(auVar25,auVar27,auVar26,0x96);
      auVar27 = vpshufb_avx512vl(auVar8,auVar24);
      auVar27 = vpternlogq_avx512vl(auVar27,auVar49,auVar28,0x96);
      auVar28 = vpand_avx2(auVar51,auVar47);
      auVar49 = vpshufb_avx2(auVar45,auVar28);
      auVar28 = vpshufb_avx2(auVar9,auVar28);
      auVar49 = vpternlogq_avx512vl(auVar49,auVar26,*(undefined1 (*) [32])((long)x + uVar12),0x96);
      auVar28 = vpternlogq_avx512vl(auVar28,auVar27,*(undefined1 (*) [32])((long)x + uVar12 + 0x20),
                                    0x96);
      *(undefined1 (*) [32])((long)x + uVar12) = auVar49;
      *(undefined1 (*) [32])((long)x + uVar12 + 0x20) = auVar28;
      *(undefined1 (*) [32])((long)y + uVar12) = auVar49 ^ auVar10;
      *(undefined1 (*) [32])((long)y + uVar12 + 0x20) = auVar28 ^ auVar11;
      uVar12 = uVar12 + 0x40;
    } while (bytes != uVar12);
  }
  else {
    if (CpuHasSSSE3 != '\x01') {
      auVar31 = vpbroadcastd_avx512f(ZEXT416(0xf));
      auVar32 = vpbroadcastd_avx512f(ZEXT416(0x10));
      auVar33 = vpbroadcastd_avx512f(ZEXT416(0x20));
      auVar34 = vpbroadcastd_avx512f(ZEXT416(0x30));
      uVar12 = 0;
      lVar13 = (ulong)log_m * 0x80 + Multiply16LUT;
      do {
        auVar35 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12 + 0x20));
        auVar36 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12));
        auVar37 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12 + 0x60));
        auVar38 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12 + 0x40));
        auVar39 = vmovdqa64_avx512f(auVar33);
        auVar40 = vpandd_avx512f(auVar35,auVar31);
        auVar41 = vpandd_avx512f(auVar36,auVar31);
        auVar35 = vpsrld_avx512f(auVar35,4);
        auVar36 = vpsrld_avx512f(auVar36,4);
        auVar39 = vpternlogd_avx512f(auVar39,auVar38,auVar31,0xf8);
        auVar38 = vpsrld_avx512f(auVar38,4);
        auVar29 = vextracti64x4_avx512f(auVar40,1);
        auVar40 = vpmovzxdq_avx512f(auVar40._0_32_);
        auVar30 = vextracti64x4_avx512f(auVar41,1);
        auVar41 = vpmovzxdq_avx512f(auVar41._0_32_);
        auVar38 = vpord_avx512f(auVar38,auVar34);
        auVar42 = vpmovzxdq_avx512f(auVar29);
        auVar43 = vpmovzxdq_avx512f(auVar30);
        auVar1 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar42._0_4_ * 2)),
                             (uint)*(ushort *)(lVar13 + (ulong)auVar42._8_4_ * 2),1);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar42._16_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar42,2);
        auVar20 = vextracti32x4_avx512f(auVar42,3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar42._24_4_ * 2),3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),6);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),7);
        auVar19 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar40._0_4_ * 2)),
                              (uint)*(ushort *)(lVar13 + (ulong)auVar40._8_4_ * 2),1);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar40._16_4_ * 2),2);
        auVar20 = vextracti32x4_avx512f(auVar40,2);
        auVar21 = vextracti32x4_avx512f(auVar40,3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar40._24_4_ * 2),3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),4);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),5);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),6);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),7);
        auVar20 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar43._0_4_ * 2)),
                              (uint)*(ushort *)(lVar13 + (ulong)auVar43._8_4_ * 2),1);
        auVar30._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar19;
        auVar30._16_16_ = ZEXT116(1) * auVar1;
        auVar1 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar13 + (ulong)auVar43._16_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar43,2);
        auVar20 = vextracti32x4_avx512f(auVar43,3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar43._24_4_ * 2),3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),6);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),7);
        auVar19 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar41._0_4_ * 2)),
                              (uint)*(ushort *)(lVar13 + (ulong)auVar41._8_4_ * 2),1);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar41._16_4_ * 2),2);
        auVar20 = vextracti32x4_avx512f(auVar41,2);
        auVar21 = vextracti32x4_avx512f(auVar41,3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar41._24_4_ * 2),3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),4);
        auVar36 = vpord_avx512f(auVar36,auVar32);
        auVar35 = vpord_avx512f(auVar35,auVar32);
        auVar29 = vextracti64x4_avx512f(auVar35,1);
        auVar35 = vpmovzxdq_avx512f(auVar35._0_32_);
        auVar40 = vpmovzxdq_avx512f(auVar29);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),5);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),6);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),7);
        auVar29 = vextracti64x4_avx512f(auVar36,1);
        auVar36 = vpmovzxdq_avx512f(auVar36._0_32_);
        auVar41 = vpmovzxdq_avx512f(auVar29);
        auVar20 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar40._0_4_ * 2)),
                              (uint)*(ushort *)(lVar13 + (ulong)auVar40._8_4_ * 2),1);
        auVar42 = vinserti64x4_avx512f
                            (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                                 ZEXT116(0) * auVar1 + ZEXT116(1) * auVar19)),
                             auVar30,1);
        auVar1 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar13 + (ulong)auVar40._16_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar40,2);
        auVar20 = vextracti32x4_avx512f(auVar40,3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar40._24_4_ * 2),3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),6);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),7);
        auVar19 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar35._0_4_ * 2)),
                              (uint)*(ushort *)(lVar13 + (ulong)auVar35._8_4_ * 2),1);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar35._16_4_ * 2),2);
        auVar20 = vextracti32x4_avx512f(auVar35,2);
        auVar21 = vextracti32x4_avx512f(auVar35,3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar35._24_4_ * 2),3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),4);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),5);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),6);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),7);
        auVar20 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar41._0_4_ * 2)),
                              (uint)*(ushort *)(lVar13 + (ulong)auVar41._8_4_ * 2),1);
        auVar44._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar19;
        auVar44._16_16_ = ZEXT116(1) * auVar1;
        auVar1 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar13 + (ulong)auVar41._16_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar41,2);
        auVar20 = vextracti32x4_avx512f(auVar41,3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar41._24_4_ * 2),3);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),6);
        auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),7);
        auVar19 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar36._0_4_ * 2)),
                              (uint)*(ushort *)(lVar13 + (ulong)auVar36._8_4_ * 2),1);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar36._16_4_ * 2),2);
        auVar20 = vextracti32x4_avx512f(auVar36,2);
        auVar21 = vextracti32x4_avx512f(auVar36,3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar36._24_4_ * 2),3);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),4);
        auVar35 = vmovdqa64_avx512f(auVar33);
        auVar35 = vpternlogd_avx512f(auVar35,auVar37,auVar31,0xf8);
        auVar36 = vpsrld_avx512f(auVar37,4);
        auVar29 = vextracti64x4_avx512f(auVar35,1);
        auVar35 = vpmovzxdq_avx512f(auVar35._0_32_);
        auVar36 = vpord_avx512f(auVar36,auVar34);
        auVar30 = vextracti64x4_avx512f(auVar36,1);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),5);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),6);
        auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),7);
        auVar37 = vpmovzxdq_avx512f(auVar29);
        auVar29 = vextracti64x4_avx512f(auVar39,1);
        auVar39 = vpmovzxdq_avx512f(auVar39._0_32_);
        auVar40 = vpmovzxdq_avx512f(auVar29);
        auVar20 = vextracti32x4_avx512vl(auVar37._0_32_,1);
        auVar41 = vinserti64x4_avx512f
                            (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                                 ZEXT116(0) * auVar1 + ZEXT116(1) * auVar19)),
                             auVar44,1);
        auVar41 = vpxorq_avx512f(auVar41,auVar42);
        auVar1 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar37._0_4_ * 2)),
                                  (uint)*(ushort *)(lVar13 + (ulong)auVar37._8_4_ * 2),1);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar37,2);
        auVar21 = vextracti32x4_avx512f(auVar37,3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar20 = vextracti32x4_avx512vl(auVar35._0_32_,1);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),6);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),7);
        auVar19 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar35._0_4_ * 2)),
                                   (uint)*(ushort *)(lVar13 + (ulong)auVar35._8_4_ * 2),1);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),2);
        auVar21 = vextracti32x4_avx512f(auVar35,2);
        auVar22 = vextracti32x4_avx512f(auVar35,3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
        auVar23 = vextracti32x4_avx512vl(auVar40._0_32_,1);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
        auVar20 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar40._0_4_ * 2)),
                                   (uint)*(ushort *)(lVar13 + (ulong)auVar40._8_4_ * 2),1);
        auVar45._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar19;
        auVar45._16_16_ = ZEXT116(1) * auVar1;
        auVar1 = vpinsrw_avx512bw(auVar20,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar40,2);
        auVar20 = vextracti32x4_avx512f(auVar40,3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar21 = vextracti32x4_avx512vl(auVar39._0_32_,1);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),6);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),7);
        auVar19 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar39._0_4_ * 2)),
                                   (uint)*(ushort *)(lVar13 + (ulong)auVar39._8_4_ * 2),1);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),2);
        auVar20 = vextracti32x4_avx512f(auVar39,2);
        auVar22 = vextracti32x4_avx512f(auVar39,3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),4);
        auVar35 = vpmovzxdq_avx512f(auVar30);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),5);
        auVar21 = vextracti32x4_avx512vl(auVar35._0_32_,1);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
        auVar36 = vpmovzxdq_avx512f(auVar36._0_32_);
        auVar29 = vextracti64x4_avx512f(auVar38,1);
        auVar37 = vpmovzxdq_avx512f(auVar29);
        auVar38 = vpmovzxdq_avx512f(auVar38._0_32_);
        auVar20 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar35._0_4_ * 2)),
                                   (uint)*(ushort *)(lVar13 + (ulong)auVar35._8_4_ * 2),1);
        auVar29 = vinserti32x4_avx512vl(ZEXT1632(auVar19),auVar1,1);
        auVar39 = vinserti64x4_avx512f(ZEXT3264(auVar29),auVar45,1);
        auVar1 = vpinsrw_avx512bw(auVar20,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar35,2);
        auVar20 = vextracti32x4_avx512f(auVar35,3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar21 = vextracti32x4_avx512vl(auVar36._0_32_,1);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),6);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),7);
        auVar19 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar36._0_4_ * 2)),
                                   (uint)*(ushort *)(lVar13 + (ulong)auVar36._8_4_ * 2),1);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),2);
        auVar20 = vextracti32x4_avx512f(auVar36,2);
        auVar22 = vextracti32x4_avx512f(auVar36,3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),4);
        auVar21 = vextracti32x4_avx512vl(auVar37._0_32_,1);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),5);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
        auVar20 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar37._0_4_ * 2)),
                                   (uint)*(ushort *)(lVar13 + (ulong)auVar37._8_4_ * 2),1);
        auVar29 = vinserti32x4_avx512vl(ZEXT1632(auVar19),auVar1,1);
        auVar1 = vpinsrw_avx512bw(auVar20,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),2);
        auVar19 = vextracti32x4_avx512f(auVar37,2);
        auVar20 = vextracti32x4_avx512f(auVar37,3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),3);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._0_4_ * 2),4);
        auVar21 = vextracti32x4_avx512vl(auVar38._0_32_,1);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar19._8_4_ * 2),5);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),6);
        auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),7);
        auVar19 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar38._0_4_ * 2)),
                                   (uint)*(ushort *)(lVar13 + (ulong)auVar38._8_4_ * 2),1);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),2);
        auVar20 = vextracti32x4_avx512f(auVar38,2);
        auVar22 = vextracti32x4_avx512f(auVar38,3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),3);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._0_4_ * 2),4);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar20._8_4_ * 2),5);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
        auVar19 = vpinsrw_avx512bw(auVar19,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
        auVar35 = vinserti64x4_avx512f
                            (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                                 ZEXT116(0) * auVar1 + ZEXT116(1) * auVar19)),
                             auVar29,1);
        auVar35 = vpternlogq_avx512f(auVar35,auVar41,auVar39,0x96);
        auVar29 = vpmovwb_avx512bw(auVar35);
        *(undefined1 (*) [32])((long)x + uVar12) =
             auVar29 ^ *(undefined1 (*) [32])((long)x + uVar12);
        auVar35 = vpsrlw_avx512bw(auVar35,8);
        auVar29 = vpmovwb_avx512bw(auVar35);
        *(undefined1 (*) [32])((long)x + uVar12 + 0x20) =
             auVar29 ^ *(undefined1 (*) [32])((long)x + uVar12 + 0x20);
        uVar12 = uVar12 + 0x40;
      } while (bytes != uVar12);
      xor_mem(y,x,bytes);
      return;
    }
    auVar46[8] = 0xf;
    auVar46._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar46[9] = 0xf;
    auVar46[10] = 0xf;
    auVar46[0xb] = 0xf;
    auVar46[0xc] = 0xf;
    auVar46[0xd] = 0xf;
    auVar46[0xe] = 0xf;
    auVar46[0xf] = 0xf;
    lVar13 = (ulong)log_m * 0x80;
    auVar1 = *(undefined1 (*) [16])(Multiply128LUT + lVar13);
    auVar19 = *(undefined1 (*) [16])(Multiply128LUT + 0x10 + lVar13);
    auVar20 = *(undefined1 (*) [16])(Multiply128LUT + 0x20 + lVar13);
    auVar21 = *(undefined1 (*) [16])(Multiply128LUT + 0x30 + lVar13);
    auVar22 = *(undefined1 (*) [16])(Multiply128LUT + 0x40 + lVar13);
    auVar23 = *(undefined1 (*) [16])(Multiply128LUT + 0x50 + lVar13);
    auVar2 = *(undefined1 (*) [16])(Multiply128LUT + 0x60 + lVar13);
    auVar3 = *(undefined1 (*) [16])(Multiply128LUT + 0x70 + lVar13);
    uVar12 = 0;
    do {
      auVar4 = *(undefined1 (*) [16])((long)y + uVar12 + 0x10);
      auVar5 = *(undefined1 (*) [16])((long)y + uVar12 + 0x30);
      auVar48 = vpsrlq_avx(auVar4,4);
      auVar18 = vpand_avx(auVar4,auVar46);
      auVar14 = vpandq_avx512vl(auVar5,auVar46);
      auVar50 = vpsrlq_avx(auVar5,4);
      auVar48 = vpand_avx(auVar48,auVar46);
      auVar16 = vpshufb_avx(auVar1,auVar18);
      auVar15 = vpshufb_avx512vl(auVar20,auVar14);
      auVar18 = vpshufb_avx(auVar22,auVar18);
      auVar17 = vpshufb_avx(auVar19,auVar48);
      auVar48 = vpshufb_avx(auVar23,auVar48);
      auVar16 = vpternlogq_avx512vl(auVar15,auVar17,auVar16,0x96);
      auVar17 = vpshufb_avx512vl(auVar2,auVar14);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar48,auVar18,0x96);
      auVar18 = vpand_avx(auVar50,auVar46);
      auVar48 = vpshufb_avx(auVar21,auVar18);
      auVar18 = vpshufb_avx(auVar3,auVar18);
      auVar48 = vpternlogq_avx512vl(auVar48,auVar16,*(undefined1 (*) [16])((long)x + uVar12 + 0x10),
                                    0x96);
      auVar18 = vpternlogq_avx512vl(auVar18,auVar17,*(undefined1 (*) [16])((long)x + uVar12 + 0x30),
                                    0x96);
      *(undefined1 (*) [16])((long)x + uVar12 + 0x10) = auVar48;
      *(undefined1 (*) [16])((long)x + uVar12 + 0x30) = auVar18;
      *(undefined1 (*) [16])((long)y + uVar12 + 0x10) = auVar48 ^ auVar4;
      *(undefined1 (*) [16])((long)y + uVar12 + 0x30) = auVar18 ^ auVar5;
      auVar4 = *(undefined1 (*) [16])((long)y + uVar12);
      auVar5 = *(undefined1 (*) [16])((long)y + uVar12 + 0x20);
      auVar48 = vpsrlq_avx(auVar4,4);
      auVar18 = vpand_avx(auVar4,auVar46);
      auVar14 = vpandq_avx512vl(auVar5,auVar46);
      auVar50 = vpsrlq_avx(auVar5,4);
      auVar48 = vpand_avx(auVar48,auVar46);
      auVar16 = vpshufb_avx(auVar1,auVar18);
      auVar15 = vpshufb_avx512vl(auVar20,auVar14);
      auVar18 = vpshufb_avx(auVar22,auVar18);
      auVar17 = vpshufb_avx(auVar19,auVar48);
      auVar48 = vpshufb_avx(auVar23,auVar48);
      auVar16 = vpternlogq_avx512vl(auVar15,auVar17,auVar16,0x96);
      auVar17 = vpshufb_avx512vl(auVar2,auVar14);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar48,auVar18,0x96);
      auVar18 = vpand_avx(auVar50,auVar46);
      auVar48 = vpshufb_avx(auVar21,auVar18);
      auVar18 = vpshufb_avx(auVar3,auVar18);
      auVar48 = vpternlogq_avx512vl(auVar48,auVar16,*(undefined1 (*) [16])((long)x + uVar12),0x96);
      auVar18 = vpternlogq_avx512vl(auVar18,auVar17,*(undefined1 (*) [16])((long)x + uVar12 + 0x20),
                                    0x96);
      *(undefined1 (*) [16])((long)x + uVar12) = auVar48;
      *(undefined1 (*) [16])((long)x + uVar12 + 0x20) = auVar18;
      *(undefined1 (*) [16])((long)y + uVar12) = auVar48 ^ auVar4;
      *(undefined1 (*) [16])((long)y + uVar12 + 0x20) = auVar18 ^ auVar5;
      uVar12 = uVar12 + 0x40;
    } while (bytes != uVar12);
  }
  return;
}

Assistant:

static void FFT_DIT2(
    void * LEO_RESTRICT x, void * LEO_RESTRICT y,
    ffe_t log_m, uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_MUL_TABLES_256(0, log_m);

        const LEO_M256 clr_mask = _mm256_set1_epi8(0x0f);

        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<LEO_M256 *>(y);

        do
        {
#define LEO_FFTB_256(x_ptr, y_ptr) { \
            LEO_M256 x_lo = _mm256_loadu_si256(x_ptr); \
            LEO_M256 x_hi = _mm256_loadu_si256(x_ptr + 1); \
            LEO_M256 y_lo = _mm256_loadu_si256(y_ptr); \
            LEO_M256 y_hi = _mm256_loadu_si256(y_ptr + 1); \
            LEO_MULADD_256(x_lo, x_hi, y_lo, y_hi, 0); \
            _mm256_storeu_si256(x_ptr, x_lo); \
            _mm256_storeu_si256(x_ptr + 1, x_hi); \
            y_lo = _mm256_xor_si256(y_lo, x_lo); \
            y_hi = _mm256_xor_si256(y_hi, x_hi); \
            _mm256_storeu_si256(y_ptr, y_lo); \
            _mm256_storeu_si256(y_ptr + 1, y_hi); }

            LEO_FFTB_256(x32, y32);
            y32 += 2, x32 += 2;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }
#endif // LEO_TRY_AVX2

    if (CpuHasSSSE3)
    {
        LEO_MUL_TABLES_128(0, log_m);

        const LEO_M128 clr_mask = _mm_set1_epi8(0x0f);

        LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
        LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<LEO_M128 *>(y);

        do
        {
#define LEO_FFTB_128(x_ptr, y_ptr) { \
                LEO_M128 x_lo = _mm_loadu_si128(x_ptr); \
                LEO_M128 x_hi = _mm_loadu_si128(x_ptr + 2); \
                LEO_M128 y_lo = _mm_loadu_si128(y_ptr); \
                LEO_M128 y_hi = _mm_loadu_si128(y_ptr + 2); \
                LEO_MULADD_128(x_lo, x_hi, y_lo, y_hi, 0); \
                _mm_storeu_si128(x_ptr, x_lo); \
                _mm_storeu_si128(x_ptr + 2, x_hi); \
                y_lo = _mm_xor_si128(y_lo, x_lo); \
                y_hi = _mm_xor_si128(y_hi, x_hi); \
                _mm_storeu_si128(y_ptr, y_lo); \
                _mm_storeu_si128(y_ptr + 2, y_hi); }

            LEO_FFTB_128(x16 + 1, y16 + 1);
            LEO_FFTB_128(x16, y16);
            x16 += 4, y16 += 4;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }

    // Reference version:
    RefMulAdd(x, y, log_m, bytes);
    xor_mem(y, x, bytes);
}